

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::rasterizePrimitive
               (RenderState *state,RenderTarget *renderTarget,Program *program,Line *line,
               IVec4 *renderTargetRect,RasterizationInternalBuffers *buffers)

{
  int primitiveID_;
  VertexPacket *pVVar1;
  VertexPacket *pVVar2;
  float *fragmentDepths_;
  FragmentShader *pFVar3;
  int numSamples_;
  reference outputArray_;
  vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_> *this;
  size_type sVar4;
  reference pvVar5;
  float a;
  float b;
  float fVar6;
  int local_2a0;
  uint local_29c;
  int sampleNdx;
  int numRasterizedPackets;
  int maxFragmentPackets;
  undefined1 local_288 [8];
  MultiSampleLineRasterizer msaaRasterizer;
  SingleSampleLineRasterizer aliasedRasterizer;
  FragmentShadingContext shadingContext;
  bool msaa;
  float depthClampMax;
  float depthClampMin;
  int numSamples;
  RasterizationInternalBuffers *buffers_local;
  IVec4 *renderTargetRect_local;
  Line *line_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  numSamples_ = RenderTarget::getNumSamples(renderTarget);
  a = de::min<float>((state->viewport).zn,(state->viewport).zf);
  b = de::max<float>((state->viewport).zn,(state->viewport).zf);
  pVVar1 = line->v0;
  pVVar2 = line->v1;
  outputArray_ = std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::operator[]
                           (&buffers->shaderOutputs,0);
  fragmentDepths_ = buffers->fragmentDepthBuffer;
  primitiveID_ = line->v1->primitiveID;
  this = rr::FragmentShader::getOutputs(program->fragmentShader);
  sVar4 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::size(this);
  FragmentShadingContext::FragmentShadingContext
            ((FragmentShadingContext *)&aliasedRasterizer.m_curRowFragment,pVVar1->outputs,
             pVVar2->outputs,(GenericVec4 *)0x0,outputArray_,fragmentDepths_,primitiveID_,(int)sVar4
             ,numSamples_,FACETYPE_FRONT);
  SingleSampleLineRasterizer::SingleSampleLineRasterizer
            ((SingleSampleLineRasterizer *)
             (msaaRasterizer.m_triangleRasterizer1.m_curPos.m_data + 1),renderTargetRect);
  MultiSampleLineRasterizer::MultiSampleLineRasterizer
            ((MultiSampleLineRasterizer *)local_288,numSamples_,renderTargetRect);
  if (numSamples_ < 2) {
    SingleSampleLineRasterizer::init
              ((SingleSampleLineRasterizer *)
               (msaaRasterizer.m_triangleRasterizer1.m_curPos.m_data + 1),
               (EVP_PKEY_CTX *)&line->v0->position);
  }
  else {
    MultiSampleLineRasterizer::init
              ((MultiSampleLineRasterizer *)local_288,(EVP_PKEY_CTX *)&line->v0->position);
  }
  while( true ) {
    sVar4 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::size
                      (&buffers->fragmentPackets);
    sampleNdx = (int)sVar4;
    local_29c = 0;
    if (numSamples_ < 2) {
      pvVar5 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::operator[]
                         (&buffers->fragmentPackets,0);
      SingleSampleLineRasterizer::rasterize
                ((SingleSampleLineRasterizer *)
                 (msaaRasterizer.m_triangleRasterizer1.m_curPos.m_data + 1),pvVar5,
                 buffers->fragmentDepthBuffer,sampleNdx,(int *)&local_29c);
    }
    else {
      pvVar5 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::operator[]
                         (&buffers->fragmentPackets,0);
      MultiSampleLineRasterizer::rasterize
                ((MultiSampleLineRasterizer *)local_288,pvVar5,buffers->fragmentDepthBuffer,
                 sampleNdx,(int *)&local_29c);
    }
    if (local_29c == 0) break;
    pFVar3 = program->fragmentShader;
    pvVar5 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::operator[]
                       (&buffers->fragmentPackets,0);
    (**pFVar3->_vptr_FragmentShader)
              (pFVar3,pvVar5,(ulong)local_29c,&aliasedRasterizer.m_curRowFragment);
    if ((buffers->fragmentDepthBuffer != (float *)0x0) &&
       (((state->fragOps).depthClampEnabled & 1U) != 0)) {
      for (local_2a0 = 0; local_2a0 < (int)(local_29c * 4 * numSamples_); local_2a0 = local_2a0 + 1)
      {
        fVar6 = de::clamp<float>(buffers->fragmentDepthBuffer[local_2a0],a,b);
        buffers->fragmentDepthBuffer[local_2a0] = fVar6;
      }
    }
    pvVar5 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::operator[]
                       (&buffers->fragmentPackets,0);
    writeFragmentPackets
              (state,renderTarget,program,pvVar5,local_29c,FACETYPE_FRONT,&buffers->shaderOutputs,
               buffers->fragmentDepthBuffer,&buffers->shadedFragments);
  }
  MultiSampleLineRasterizer::~MultiSampleLineRasterizer((MultiSampleLineRasterizer *)local_288);
  SingleSampleLineRasterizer::~SingleSampleLineRasterizer
            ((SingleSampleLineRasterizer *)
             (msaaRasterizer.m_triangleRasterizer1.m_curPos.m_data + 1));
  return;
}

Assistant:

void rasterizePrimitive (const RenderState&					state,
						 const RenderTarget&				renderTarget,
						 const Program&						program,
						 const pa::Line&					line,
						 const tcu::IVec4&					renderTargetRect,
						 RasterizationInternalBuffers&		buffers)
{
	const int					numSamples			= renderTarget.getNumSamples();
	const float					depthClampMin		= de::min(state.viewport.zn, state.viewport.zf);
	const float					depthClampMax		= de::max(state.viewport.zn, state.viewport.zf);
	const bool					msaa				= numSamples > 1;
	FragmentShadingContext		shadingContext		(line.v0->outputs, line.v1->outputs, DE_NULL, &buffers.shaderOutputs[0], buffers.fragmentDepthBuffer, line.v1->primitiveID, (int)program.fragmentShader->getOutputs().size(), numSamples, FACETYPE_FRONT);
	SingleSampleLineRasterizer	aliasedRasterizer	(renderTargetRect);
	MultiSampleLineRasterizer	msaaRasterizer		(numSamples, renderTargetRect);

	// Initialize rasterization.
	if (msaa)
		msaaRasterizer.init(line.v0->position, line.v1->position, state.line.lineWidth);
	else
		aliasedRasterizer.init(line.v0->position, line.v1->position, state.line.lineWidth);

	for (;;)
	{
		const int	maxFragmentPackets		= (int)buffers.fragmentPackets.size();
		int			numRasterizedPackets	= 0;

		// Rasterize

		if (msaa)
			msaaRasterizer.rasterize	(&buffers.fragmentPackets[0], buffers.fragmentDepthBuffer, maxFragmentPackets, numRasterizedPackets);
		else
			aliasedRasterizer.rasterize	(&buffers.fragmentPackets[0], buffers.fragmentDepthBuffer, maxFragmentPackets, numRasterizedPackets);

		// numRasterizedPackets is guaranteed to be greater than zero for shadeFragments()

		if (!numRasterizedPackets)
			break; // Rasterization finished.

		// Shade

		program.fragmentShader->shadeFragments(&buffers.fragmentPackets[0], numRasterizedPackets, shadingContext);

		// Depth clamp
		if (buffers.fragmentDepthBuffer && state.fragOps.depthClampEnabled)
			for (int sampleNdx = 0; sampleNdx < numRasterizedPackets * 4 * numSamples; ++sampleNdx)
				buffers.fragmentDepthBuffer[sampleNdx] = de::clamp(buffers.fragmentDepthBuffer[sampleNdx], depthClampMin, depthClampMax);

		// Handle fragment shader outputs

		writeFragmentPackets(state, renderTarget, program, &buffers.fragmentPackets[0], numRasterizedPackets, rr::FACETYPE_FRONT, buffers.shaderOutputs, buffers.fragmentDepthBuffer, buffers.shadedFragments);
	}
}